

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O0

bool __thiscall
vkt::tessellation::anon_unknown_0::PrimitiveSetInvariance::InvariantInnerTriangleSetTestInstance::
compare(InvariantInnerTriangleSetTestInstance *this,PerPrimitiveVec *primitivesA,
       PerPrimitiveVec *primitivesB,int param_3)

{
  TestContext *pTVar1;
  TestLog *pTVar2;
  IsInnerQuadTriangle local_2e;
  IsInnerTriangleTriangle local_2d;
  int local_2c;
  PerPrimitiveVec *pPStack_28;
  int param_3_local;
  PerPrimitiveVec *primitivesB_local;
  PerPrimitiveVec *primitivesA_local;
  InvariantInnerTriangleSetTestInstance *this_local;
  
  local_2c = param_3;
  pPStack_28 = primitivesB;
  primitivesB_local = primitivesA;
  primitivesA_local = (PerPrimitiveVec *)this;
  if ((this->super_InvarianceTestInstance).m_caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
    pTVar1 = Context::getTestContext
                       ((this->super_InvarianceTestInstance).super_TestInstance.m_context);
    pTVar2 = tcu::TestContext::getLog(pTVar1);
    this_local._7_1_ =
         compareTriangleSets<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::InvariantInnerTriangleSetTestInstance::IsInnerTriangleTriangle>
                   (primitivesA,primitivesB,pTVar2,&local_2d,"outer triangles");
  }
  else if ((this->super_InvarianceTestInstance).m_caseDef.primitiveType == TESSPRIMITIVETYPE_QUADS)
  {
    pTVar1 = Context::getTestContext
                       ((this->super_InvarianceTestInstance).super_TestInstance.m_context);
    pTVar2 = tcu::TestContext::getLog(pTVar1);
    this_local._7_1_ =
         compareTriangleSets<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::InvariantInnerTriangleSetTestInstance::IsInnerQuadTriangle>
                   (primitivesA,primitivesB,pTVar2,&local_2e,"outer triangles");
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool compare (const PerPrimitiveVec& primitivesA, const PerPrimitiveVec& primitivesB, const int) const
	{
		if (m_caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
			return compareTriangleSets(primitivesA, primitivesB, m_context.getTestContext().getLog(), IsInnerTriangleTriangle(), "outer triangles");
		else if (m_caseDef.primitiveType == TESSPRIMITIVETYPE_QUADS)
			return compareTriangleSets(primitivesA, primitivesB, m_context.getTestContext().getLog(), IsInnerQuadTriangle(), "outer triangles");
		else
		{
			DE_ASSERT(false);
			return false;
		}
	}